

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O3

bool __thiscall
IndexTree::_insert(IndexTree *this,int32_t *root,int32_t new_node,int *balance_change)

{
  Node *__s2;
  int32_t iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  short sVar6;
  Node *pNVar7;
  
  lVar5 = (long)*root;
  if (lVar5 == -1) {
    *root = new_node;
    *balance_change = 1;
  }
  else {
    pNVar7 = this->nodes;
    *balance_change = 0;
    __s2 = pNVar7 + lVar5;
    if (*(long *)pNVar7[new_node].key == *(long *)pNVar7[lVar5].key) {
      pNVar7 = pNVar7 + new_node;
      iVar3 = strcmp(pNVar7->key,__s2->key);
      if (iVar3 < 0) {
        lVar5 = 0x414;
        sVar6 = -1;
      }
      else {
        if (iVar3 == 0) {
          *root = new_node;
          iVar1 = __s2->right;
          pNVar7->left = __s2->left;
          pNVar7->right = iVar1;
          pNVar7->balance_factor = __s2->balance_factor;
          return true;
        }
        lVar5 = 0x418;
        sVar6 = 1;
      }
    }
    else {
      bVar2 = *(long *)pNVar7[lVar5].key <= *(long *)pNVar7[new_node].key;
      sVar6 = (bVar2 - 1) + (ushort)bVar2;
      lVar5 = (ulong)bVar2 * 4 + 0x414;
    }
    bVar2 = _insert(this,(int32_t *)(__s2->key + lVar5),new_node,balance_change);
    if (bVar2) {
      return true;
    }
    iVar3 = *balance_change;
    uVar4 = 0;
    sVar6 = sVar6 * (short)iVar3 + __s2->balance_factor;
    __s2->balance_factor = sVar6;
    if ((iVar3 != 0) && (sVar6 != 0)) {
      uVar4 = balance(this,root);
      uVar4 = uVar4 ^ 1;
    }
    *balance_change = uVar4;
  }
  return false;
}

Assistant:

bool IndexTree::_insert(int32_t &root, int32_t new_node, int &balance_change) {

    if (root == -1) {
        root = new_node;
        balance_change = 1;
        return false;
    }

    auto &_root = nodes[root];
    auto &_new = nodes[new_node];
    balance_change = 0;
    int height_increase = 0;

//    printf("Insert querying: %d left %d right %d key %s\n", root, _root.left, _root.right, _root.key);

    auto result = fast_string_cmp(_new.key, _root.key);

    if (__glibc_likely(result != 0)) {
        auto &sub_tree_id = result == -1 ? _root.left : _root.right;
        if (_insert(sub_tree_id, new_node, balance_change)) {
            return true;
        }
        height_increase = result * balance_change;
    } else {
        // found existing node, replace it
        root = new_node;
        _new.left = _root.left;
        _new.right = _root.right;
        _new.balance_factor = _root.balance_factor;
        return true;
    }

    _root.balance_factor += height_increase;

    if (height_increase != 0 && _root.balance_factor != 0) {
        balance_change = 1 - balance(root);
    } else {
        balance_change = 0;
    }

    return false;

}